

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

void __thiscall
ON_MappingTag::ON_MappingTag(ON_MappingTag *this,ON_TextureMapping *mapping,ON_Xform *xform)

{
  bool bVar1;
  long lVar2;
  ON_Xform *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  (this->m_mapping_id).Data1 = 0;
  (this->m_mapping_id).Data2 = 0;
  (this->m_mapping_id).Data3 = 0;
  (this->m_mapping_id).Data4[0] = '\0';
  (this->m_mapping_id).Data4[1] = '\0';
  (this->m_mapping_id).Data4[2] = '\0';
  (this->m_mapping_id).Data4[3] = '\0';
  (this->m_mapping_id).Data4[4] = '\0';
  (this->m_mapping_id).Data4[5] = '\0';
  (this->m_mapping_id).Data4[6] = '\0';
  (this->m_mapping_id).Data4[7] = '\0';
  this->m_mapping_type = no_mapping;
  this->m_mapping_crc = 0;
  memset(this,0,0x90);
  (this->m_mesh_xform).m_xform[0][0] = 1.0;
  (this->m_mesh_xform).m_xform[1][1] = 1.0;
  (this->m_mesh_xform).m_xform[2][2] = 1.0;
  (this->m_mesh_xform).m_xform[3][3] = 1.0;
  Set(this,mapping);
  bVar1 = TransformTreatedIsIdentity(xform);
  if (!bVar1) {
    pOVar3 = &this->m_mesh_xform;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pOVar3->m_xform[0][0] = xform->m_xform[0][0];
      xform = (ON_Xform *)((long)xform + ((ulong)bVar4 * -2 + 1) * 8);
      pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

ON_MappingTag::ON_MappingTag(const ON_TextureMapping & mapping, const ON_Xform * xform)
{
  Default();
  Set(mapping);
  if ( false == ON_MappingTag::TransformTreatedIsIdentity(xform))
    m_mesh_xform = *xform;
}